

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeFloat(IMkvReader *pReader,longlong pos,longlong size_,double *result)

{
  int iVar1;
  float fVar2;
  uint uVar3;
  double dVar4;
  int local_5c;
  ulong uStack_58;
  int i_1;
  double d;
  uint local_48;
  int i;
  float f;
  int status;
  uchar buf [8];
  long size;
  double *result_local;
  longlong size__local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if (((pReader == (IMkvReader *)0x0) || (pos < 0)) || ((size_ != 4 && (size_ != 8)))) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    buf = (uchar  [8])size_;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,size_,&f);
    if (iVar1 < 0) {
      pReader_local = (IMkvReader *)(long)iVar1;
    }
    else {
      if (buf == (uchar  [8])0x4) {
        local_48 = 0;
        d._4_4_ = 0;
        while( true ) {
          fVar2 = (float)(*(byte *)((long)&f + (long)d._4_4_) | local_48);
          d._4_4_ = d._4_4_ + 1;
          if (3 < d._4_4_) break;
          local_48 = (int)fVar2 << 8;
        }
        *result = (double)fVar2;
      }
      else {
        uStack_58 = 0;
        local_5c = 0;
        while( true ) {
          dVar4 = (double)(*(byte *)((long)&f + (long)local_5c) | uStack_58);
          local_5c = local_5c + 1;
          if (7 < local_5c) break;
          uStack_58 = (long)dVar4 << 8;
        }
        *result = dVar4;
      }
      uVar3 = isinf(*result);
      if (((uVar3 & 1) == 0) && (uVar3 = isnan(*result), (uVar3 & 1) == 0)) {
        return 0;
      }
      pReader_local = (IMkvReader *)0xfffffffffffffffe;
    }
  }
  return (long)pReader_local;
}

Assistant:

long UnserializeFloat(IMkvReader* pReader, long long pos, long long size_,
                      double& result) {
  if (!pReader || pos < 0 || ((size_ != 4) && (size_ != 8)))
    return E_FILE_FORMAT_INVALID;

  const long size = static_cast<long>(size_);

  unsigned char buf[8];

  const int status = pReader->Read(pos, size, buf);

  if (status < 0)  // error
    return status;

  if (size == 4) {
    union {
      float f;
      uint32_t ff;
      static_assert(sizeof(float) == sizeof(uint32_t), "");
    };

    ff = 0;

    for (int i = 0;;) {
      ff |= buf[i];

      if (++i >= 4)
        break;

      ff <<= 8;
    }

    result = f;
  } else {
    union {
      double d;
      uint64_t dd;
      static_assert(sizeof(double) == sizeof(uint64_t), "");
    };

    dd = 0;

    for (int i = 0;;) {
      dd |= buf[i];

      if (++i >= 8)
        break;

      dd <<= 8;
    }

    result = d;
  }

  if (mkvparser::isinf(result) || mkvparser::isnan(result))
    return E_FILE_FORMAT_INVALID;

  return 0;
}